

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::SIMDFastPFor<4U>::__encodeArray
          (SIMDFastPFor<4U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint *puVar1;
  pointer pvVar2;
  long lVar3;
  pointer __src;
  uint8_t uVar4;
  uint32_t *puVar5;
  SIMDFastPFor<4U> *pSVar6;
  ulong uVar7;
  uint32_t *puVar8;
  long lVar9;
  uint *puVar10;
  uint32_t bit;
  uint32_t *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  pointer puVar15;
  ulong uVar16;
  uint32_t k;
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint local_64;
  uint32_t *local_60;
  size_t *local_58;
  SIMDFastPFor<4U> *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  pvVar2 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar9 = 8; lVar9 != 800; lVar9 = lVar9 + 0x18) {
    lVar3 = *(long *)((long)pvVar2 + lVar9 + -8);
    if (*(long *)((long)&(pvVar2->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data + lVar9) != lVar3) {
      *(long *)((long)&(pvVar2->
                       super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                       )._M_impl.super__Vector_impl_data + lVar9) = lVar3;
    }
  }
  puVar8 = out + 1;
  puVar15 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = in + length;
  local_60 = out;
  local_50 = this;
  while (pSVar6 = local_50, puVar5 = local_60, puVar11 = in + 0x80, puVar11 <= local_48) {
    getBestBFromData(local_50,in,&bestb,&bestcexcept,&maxb);
    uVar4 = bestb;
    *puVar15 = bestb;
    puVar15[1] = bestcexcept;
    if (bestcexcept == '\0') {
      puVar15 = puVar15 + 2;
    }
    else {
      uVar16 = (ulong)maxb;
      uVar7 = (ulong)bestb;
      puVar15[2] = maxb;
      puVar15 = puVar15 + 3;
      pvVar2 = (pSVar6->datatobepacked).
               super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40 = puVar11;
      local_38 = puVar8;
      for (lVar9 = 0; puVar11 = local_40, puVar8 = local_38, lVar9 != 0x80; lVar9 = lVar9 + 1) {
        if (in[lVar9] >> (uVar4 & 0x1f) != 0) {
          local_64 = in[lVar9] >> (bestb & 0x1f);
          std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
          emplace_back<unsigned_int>(pvVar2 + (uVar16 - uVar7),&local_64);
          *puVar15 = (uchar)lVar9;
          puVar15 = puVar15 + 1;
        }
      }
    }
    puVar8 = packblockupsimd(in,puVar8,(uint)bestb);
    in = puVar11;
  }
  *local_60 = (uint32_t)((ulong)((long)puVar8 - (long)local_60) >> 2);
  __src = (local_50->bytescontainer).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar16 = (long)puVar15 - (long)__src;
  uVar7 = uVar16 & 0xffffffff;
  *puVar8 = (uint32_t)uVar16;
  memcpy(puVar8 + 1,__src,uVar7);
  puVar1 = (uint *)((long)puVar8 + (uVar7 + 3 & 0xfffffffffffffffc) + 4);
  for (puVar10 = (uint *)((long)puVar8 + uVar7 + 4); puVar10 < puVar1;
      puVar10 = (uint *)((long)puVar10 + 1)) {
    *(undefined1 *)puVar10 = 0;
  }
  pvVar2 = (pSVar6->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = 1;
  uVar12 = 0;
  for (lVar9 = 0x38; lVar9 != 800; lVar9 = lVar9 + 0x18) {
    uVar14 = 1 << (uVar13 & 0x1f);
    if (*(long *)((long)&(pvVar2->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data + lVar9) ==
        *(long *)((long)pvVar2 + lVar9 + -8)) {
      uVar14 = 0;
    }
    uVar13 = uVar13 + 1;
    uVar12 = uVar12 | uVar14;
  }
  *puVar1 = uVar12;
  puVar8 = puVar1 + 1;
  bit = 2;
  for (lVar9 = 0; lVar9 != 0x2e8; lVar9 = lVar9 + 0x18) {
    pvVar2 = (pSVar6->datatobepacked).
             super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&pvVar2[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar9 + 8) !=
        *(long *)((long)&pvVar2[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar9)) {
      puVar8 = SIMDFastPFor<4u>::
               packmeupwithoutmasksimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                         ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                           *)((long)&pvVar2[2].
                                     super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                     ._M_impl.super__Vector_impl_data + lVar9),puVar8,bit);
    }
    bit = bit + 1;
  }
  *local_58 = (long)puVar8 - (long)puVar5 >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    for (uint32_t k = 0; k < 32 + 1; ++k)
      datatobepacked[k].clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<uint32_t, cacheallocator> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockupsimd(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    uint32_t bitmap = 0;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() != 0)
        bitmap |= (1U << (k - 1));
    }
    *(out++) = bitmap;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() > 0)
        out = packmeupwithoutmasksimd(datatobepacked[k], out, k);
    }
    nvalue = out - initout;
  }